

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O0

u32 crc32_x86_vpclmulqdq_avx512_vl256(u32 crc,u8 *p,size_t len)

{
  byte bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong in_RDX;
  undefined1 (*in_RSI) [16];
  uint in_EDI;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m256i y0;
  size_t align;
  __m128i x1;
  __m128i x0;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m128i barrett_reduction_constants;
  __m128i mults_128b;
  __m256i mults_1v;
  __m256i mults_2v;
  __m256i mults_4v;
  __m256i mults_8v;
  size_t i;
  __m128i x1_2;
  __m128i x0_2;
  __m128i rshift_1;
  __m128i lshift_1;
  __m128i x1_1;
  __m128i x0_1;
  __m128i rshift;
  __m128i lshift;
  ulong local_1cc8;
  ulong local_1cc0;
  ulong local_1c80;
  undefined1 local_1c70 [16];
  ulong local_1ab8;
  undefined1 (*local_1ab0) [16];
  ulong local_1aa0;
  ulong uStack_1a98;
  ulong local_1a80;
  ulong uStack_1a78;
  ulong local_1a60;
  ulong local_1a40;
  uint local_1a24;
  ulong local_1a00;
  ulong local_19f0;
  ulong local_1700;
  ulong uStack_16f8;
  ulong local_16e0;
  ulong uStack_16d8;
  ulong local_1690;
  ulong uStack_1688;
  ulong local_1670;
  ulong uStack_1668;
  ulong local_1620;
  ulong uStack_1618;
  ulong local_1600;
  ulong uStack_15f8;
  ulong local_15b0;
  ulong uStack_15a8;
  ulong local_1590;
  ulong uStack_1588;
  ulong local_1540;
  ulong uStack_1538;
  ulong local_1520;
  ulong uStack_1518;
  ulong local_13a0;
  ulong uStack_1398;
  ulong local_1390;
  ulong uStack_1388;
  ulong local_1270;
  ulong uStack_1268;
  ulong local_1250;
  ulong uStack_1248;
  ulong local_1230;
  ulong uStack_1228;
  ulong local_1220;
  ulong uStack_1218;
  ulong local_1100;
  ulong uStack_10f8;
  ulong local_10e0;
  ulong uStack_10d8;
  
  vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  vpunpcklqdq_avx(ZEXT816(0xce3371cb),ZEXT816(0xe95c1271));
  vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  vpunpcklqdq_avx(ZEXT816(0x33fff533),ZEXT816(0x910eeec1));
  vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  vpunpcklqdq_avx(ZEXT816(0x8f352d95),ZEXT816(0x1d9513d7));
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  vpunpcklqdq_avx(ZEXT816(0xf1da05aa),ZEXT816(0x81256527));
  auVar42 = vpunpcklqdq_avx(ZEXT816(0xae689191),ZEXT816(0xccaa009e));
  local_1a80 = auVar42._0_8_;
  uStack_1a78 = auVar42._8_8_;
  auVar42 = vpunpcklqdq_avx(ZEXT816(0xb4e5b025f7011641),ZEXT816(0x1db710641));
  local_1aa0 = auVar42._0_8_;
  uStack_1a98 = auVar42._8_8_;
  local_1a60 = CONCAT44(0,in_EDI);
  if (0xff < in_RDX) {
    local_1ab8 = in_RDX;
    if ((0x10000 < in_RDX) && (((ulong)in_RSI & 0x1f) != 0)) {
      uVar41 = -(long)in_RSI;
      local_1cc8 = uVar41 & 0x1f;
      local_1ab8 = in_RDX - local_1cc8;
      local_1c70._8_8_ = *(undefined8 *)(*in_RSI + 8);
      local_1c70._0_8_ = *(ulong *)*in_RSI ^ local_1a60;
      local_1ab0 = in_RSI + 1;
      if ((uVar41 & 0xf) != 0) {
        uVar40 = uVar41 & 0xf;
        auVar38._8_8_ = local_1c70._8_8_;
        auVar38._0_8_ = local_1c70._0_8_;
        auVar3 = vpshufb_avx(auVar38,*(undefined1 (*) [16])(shift_tab + uVar40));
        auVar42._8_8_ = local_1c70._8_8_;
        auVar42._0_8_ = local_1c70._0_8_;
        auVar42 = vpshufb_avx(auVar42,*(undefined1 (*) [16])(shift_tab + uVar40 + 0x10));
        auVar42 = vpblendvb_avx(auVar42,*(undefined1 (*) [16])(local_1ab0[-1] + uVar40),
                                *(undefined1 (*) [16])(shift_tab + uVar40 + 0x10));
        local_1220 = auVar3._0_8_;
        uStack_1218 = auVar3._8_8_;
        local_1230 = auVar42._0_8_;
        uStack_1228 = auVar42._8_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_1220;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_1a80;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar3 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar43 << uVar2;
          }
        }
        local_10e0 = auVar42._0_8_;
        uStack_10d8 = auVar42._8_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uStack_1218;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uStack_1a78;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar24 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar31 << uVar2;
          }
        }
        local_1100 = auVar42._0_8_;
        uStack_10f8 = auVar42._8_8_;
        local_1c70._0_8_ = local_1230 ^ local_10e0 ^ local_1100;
        local_1c70._8_8_ = uStack_1228 ^ uStack_10d8 ^ uStack_10f8;
        local_1ab0 = (undefined1 (*) [16])(*local_1ab0 + (uVar41 & 0xf));
        local_1cc8 = uVar41 & 0x10;
      }
      for (; local_1cc8 != 0; local_1cc8 = local_1cc8 - 0x10) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_1c70._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_1a80;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar6 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar13 << uVar2;
          }
        }
        local_1600 = auVar42._0_8_;
        uStack_15f8 = auVar42._8_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_1c70._8_8_;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uStack_1a78;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar25 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar32 << uVar2;
          }
        }
        local_1620 = auVar42._0_8_;
        uStack_1618 = auVar42._8_8_;
        local_1c70._0_8_ = *(ulong *)*local_1ab0 ^ local_1600 ^ local_1620;
        local_1c70._8_8_ = *(ulong *)(*local_1ab0 + 8) ^ uStack_15f8 ^ uStack_1618;
        local_1ab0 = local_1ab0 + 1;
      }
    }
    if (0x1ff < local_1ab8) {
      halt_baddata();
    }
    halt_baddata();
  }
  if (in_RDX < 0x20) {
    if (in_RDX < 0x10) {
      if (in_RDX < 4) {
        local_1a24 = in_EDI;
        for (local_1a40 = 0; local_1a40 < in_RDX; local_1a40 = local_1a40 + 1) {
          local_1a24 = local_1a24 >> 8 ^
                       crc32_slice1_table
                       [(int)(local_1a24 & 0xff ^ (uint)(byte)(*in_RSI)[local_1a40])];
        }
        return local_1a24;
      }
      local_1ab8._0_1_ = (byte)in_RDX;
      uVar39 = (short)(1 << ((byte)local_1ab8 & 0x1f)) - 1;
      auVar42 = vmovdqu8_avx512vl(*in_RSI);
      bVar1 = (byte)(uVar39 >> 8);
      auVar36[9] = (bVar1 >> 1 & 1) * auVar42[9];
      auVar36[8] = (char)((uVar39 & 0x101) >> 8) * auVar42[8];
      auVar36[10] = (bVar1 >> 2 & 1) * auVar42[10];
      auVar36[0xb] = (bVar1 >> 3 & 1) * auVar42[0xb];
      auVar36[0xc] = (bVar1 >> 4 & 1) * auVar42[0xc];
      auVar36[0xd] = (bVar1 >> 5 & 1) * auVar42[0xd];
      auVar36[0xe] = (bVar1 >> 6 & 1) * auVar42[0xe];
      auVar36[0xf] = -((char)bVar1 >> 7) * auVar42[0xf];
      auVar36._0_8_ =
           local_1a60 ^
           CONCAT17(((byte)(uVar39 >> 7) & 1) * auVar42[7],
                    CONCAT16(((byte)(uVar39 >> 6) & 1) * auVar42[6],
                             CONCAT15(((byte)(uVar39 >> 5) & 1) * auVar42[5],
                                      CONCAT14(((byte)(uVar39 >> 4) & 1) * auVar42[4],
                                               CONCAT13(((byte)(uVar39 >> 3) & 1) * auVar42[3],
                                                        CONCAT12(((byte)(uVar39 >> 2) & 1) *
                                                                 auVar42[2],
                                                                 CONCAT11(((byte)(uVar39 >> 1) & 1)
                                                                          * auVar42[1],
                                                                          (char)(uVar39 & 0x101) *
                                                                          auVar42[0])))))));
      local_1c70 = vpshufb_avx(auVar36,*(undefined1 (*) [16])(shift_tab + in_RDX));
      goto LAB_0012a75f;
    }
    local_1c70._0_8_ = *(ulong *)*in_RSI ^ local_1a60;
    local_1c70._8_8_ = *(ulong *)(*in_RSI + 8);
    if (0x1f < in_RDX) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1c70._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1a80;
      auVar42 = (undefined1  [16])0x0;
      for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
        if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
          auVar42 = auVar42 ^ auVar11 << uVar2;
        }
      }
      local_1520 = auVar42._0_8_;
      uStack_1518 = auVar42._8_8_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)(*in_RSI + 8);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uStack_1a78;
      auVar42 = (undefined1  [16])0x0;
      for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
        if ((auVar22 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
          auVar42 = auVar42 ^ auVar29 << uVar2;
        }
      }
      local_1540 = auVar42._0_8_;
      uStack_1538 = auVar42._8_8_;
      local_1c70._0_8_ = *(ulong *)in_RSI[1] ^ local_1520 ^ local_1540;
      local_1c70._8_8_ = *(ulong *)(in_RSI[1] + 8) ^ uStack_1518 ^ uStack_1538;
      if (0x2f < in_RDX) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_1c70._0_8_;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_1a80;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar5 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar12 << uVar2;
          }
        }
        local_1590 = auVar42._0_8_;
        uStack_1588 = auVar42._8_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_1c70._8_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uStack_1a78;
        auVar42 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar23 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar42 = auVar42 ^ auVar30 << uVar2;
          }
        }
        local_15b0 = auVar42._0_8_;
        uStack_15a8 = auVar42._8_8_;
        local_1c70._8_8_ = *(ulong *)(in_RSI[2] + 8) ^ uStack_1588 ^ uStack_15a8;
        local_1c70._0_8_ = *(ulong *)in_RSI[2] ^ local_1590 ^ local_15b0;
      }
    }
    local_1ab0 = (undefined1 (*) [16])(*in_RSI + (in_RDX & 0xfffffffffffffff0));
  }
  else {
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_1a60;
    local_1cc0 = SUB168(ZEXT116(1) * auVar37,0);
    local_1cc0 = *(ulong *)*in_RSI ^ local_1cc0;
    if (0x3f < in_RDX) {
      if (in_RDX < 0x80) {
        halt_baddata();
      }
      halt_baddata();
    }
    local_1ab0 = in_RSI + 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1cc0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_1a80;
    auVar42 = (undefined1  [16])0x0;
    for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
        auVar42 = auVar42 ^ auVar14 << uVar2;
      }
    }
    local_1670 = auVar42._0_8_;
    uStack_1668 = auVar42._8_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_1cc0;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uStack_1a78;
    auVar42 = (undefined1  [16])0x0;
    for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
      if ((auVar26 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
        auVar42 = auVar42 ^ auVar33 << uVar2;
      }
    }
    local_1690 = auVar42._0_8_;
    uStack_1688 = auVar42._8_8_;
    local_1c70._0_8_ = local_1cc0 ^ local_1670 ^ local_1690;
    local_1c70._8_8_ = local_1cc0 ^ uStack_1668 ^ uStack_1688;
    if ((in_RDX & 0x10) != 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1c70._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1a80;
      auVar42 = (undefined1  [16])0x0;
      for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
        if ((auVar8 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
          auVar42 = auVar42 ^ auVar15 << uVar2;
        }
      }
      local_16e0 = auVar42._0_8_;
      uStack_16d8 = auVar42._8_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_1c70._8_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uStack_1a78;
      auVar42 = (undefined1  [16])0x0;
      for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
        if ((auVar27 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
          auVar42 = auVar42 ^ auVar34 << uVar2;
        }
      }
      local_1700 = auVar42._0_8_;
      uStack_16f8 = auVar42._8_8_;
      local_1c70._8_8_ = *(ulong *)(in_RSI[2] + 8) ^ uStack_16d8 ^ uStack_16f8;
      local_1c70._0_8_ = *(ulong *)*local_1ab0 ^ local_16e0 ^ local_1700;
      local_1ab0 = in_RSI + 3;
    }
  }
  uVar41 = in_RDX & 0xf;
  if (uVar41 != 0) {
    auVar3 = vpshufb_avx(local_1c70,*(undefined1 (*) [16])(shift_tab + uVar41));
    auVar42 = vpshufb_avx(local_1c70,*(undefined1 (*) [16])(shift_tab + uVar41 + 0x10));
    auVar42 = vpblendvb_avx(auVar42,*(undefined1 (*) [16])(local_1ab0[-1] + uVar41),
                            *(undefined1 (*) [16])(shift_tab + uVar41 + 0x10));
    local_1390 = auVar3._0_8_;
    uStack_1388 = auVar3._8_8_;
    local_13a0 = auVar42._0_8_;
    uStack_1398 = auVar42._8_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1390;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_1a80;
    auVar42 = (undefined1  [16])0x0;
    for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
      if ((auVar9 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
        auVar42 = auVar42 ^ auVar16 << uVar2;
      }
    }
    local_1250 = auVar42._0_8_;
    uStack_1248 = auVar42._8_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uStack_1388;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uStack_1a78;
    auVar42 = (undefined1  [16])0x0;
    for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
      if ((auVar28 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
        auVar42 = auVar42 ^ auVar35 << uVar2;
      }
    }
    local_1270 = auVar42._0_8_;
    uStack_1268 = auVar42._8_8_;
    local_1c70._8_8_ = uStack_1398 ^ uStack_1248 ^ uStack_1268;
    local_1c70._0_8_ = local_13a0 ^ local_1250 ^ local_1270;
  }
LAB_0012a75f:
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_1c70._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uStack_1a78;
  auVar42 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar18 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar42 = auVar42 ^ auVar20 << uVar2;
    }
  }
  auVar43 = vpsrldq_avx(local_1c70,8);
  local_19f0 = auVar42._0_8_;
  local_1a00 = auVar43._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_19f0 ^ local_1a00;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_1aa0;
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar10 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ auVar17 << uVar2;
    }
  }
  local_1c80 = auVar3._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_1c80;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uStack_1a98;
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar19 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ auVar21 << uVar2;
    }
  }
  local_1c70._8_4_ = auVar42._8_4_ ^ auVar43._8_4_ ^ auVar3._8_4_;
  return local_1c70._8_4_;
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}